

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall duckdb::Vector::Reinterpret(Vector *this,Vector *other)

{
  Vector *in_RSI;
  Vector *in_RDI;
  Vector new_vector;
  Vector *in_stack_ffffffffffffff38;
  Vector *in_stack_ffffffffffffff40;
  shared_ptr<duckdb::VectorBuffer,_true> *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff68;
  data_ptr_t in_stack_ffffffffffffffb0;
  element_type *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  Vector *in_stack_ffffffffffffffe8;
  
  in_RDI->vector_type = in_RSI->vector_type;
  AssignSharedPointer<duckdb::VectorBuffer>
            ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff40,
             (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff38);
  if (in_RDI->vector_type == DICTIONARY_VECTOR) {
    GetType(in_RDI);
    in_stack_ffffffffffffff40 = (Vector *)&stack0xffffffffffffff70;
    LogicalType::LogicalType
              ((LogicalType *)in_stack_ffffffffffffff40,(LogicalType *)in_stack_ffffffffffffff38);
    Vector((Vector *)in_stack_ffffffffffffffc0._M_pi,(LogicalType *)in_stack_ffffffffffffffb8,
           in_stack_ffffffffffffffb0);
    LogicalType::~LogicalType((LogicalType *)0x2bcb59e);
    in_stack_ffffffffffffff38 = DictionaryVector::Child((Vector *)0x2bcb5ab);
    Reinterpret(in_RSI,in_stack_ffffffffffffffe8);
    make_shared_ptr<duckdb::VectorChildBuffer,_duckdb::Vector>(in_stack_ffffffffffffff68);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorChildBuffer,_0>
              (in_stack_ffffffffffffff50,(shared_ptr<duckdb::VectorChildBuffer,_true> *)in_RDI);
    shared_ptr<duckdb::VectorChildBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorChildBuffer,_true> *)0x2bcb5f1);
    ~Vector(in_stack_ffffffffffffff40);
  }
  else {
    AssignSharedPointer<duckdb::VectorBuffer>
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff40,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff38);
  }
  in_RDI->data = in_RSI->data;
  ValidityMask::operator=
            ((ValidityMask *)in_stack_ffffffffffffff40,(ValidityMask *)in_stack_ffffffffffffff38);
  return;
}

Assistant:

void Vector::Reinterpret(const Vector &other) {
	vector_type = other.vector_type;
#ifdef DEBUG
	auto &this_type = GetType();
	auto &other_type = other.GetType();

	auto type_is_same = other_type == this_type;
	bool this_is_nested = this_type.IsNested();
	bool other_is_nested = other_type.IsNested();

	bool not_nested = this_is_nested == false && other_is_nested == false;
	bool type_size_equal = GetTypeIdSize(this_type.InternalType()) == GetTypeIdSize(other_type.InternalType());
	//! Either the types are completely identical, or they are not nested and their physical type size is the same
	//! The reason nested types are not allowed is because copying the auxiliary buffer does not happen recursively
	//! e.g DOUBLE[] to BIGINT[], the type of the LIST would say BIGINT but the child Vector says DOUBLE
	D_ASSERT((not_nested && type_size_equal) || type_is_same);
#endif
	AssignSharedPointer(buffer, other.buffer);
	if (vector_type == VectorType::DICTIONARY_VECTOR) {
		Vector new_vector(GetType(), nullptr);
		new_vector.Reinterpret(DictionaryVector::Child(other));
		auxiliary = make_shared_ptr<VectorChildBuffer>(std::move(new_vector));
	} else {
		AssignSharedPointer(auxiliary, other.auxiliary);
	}
	data = other.data;
	validity = other.validity;
}